

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O0

bool __thiscall
OSSLRSA::reconstructPrivateKey(OSSLRSA *this,PrivateKey **ppPrivateKey,ByteString *serialisedData)

{
  uint uVar1;
  size_t sVar2;
  OSSLRSAPrivateKey *this_00;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  OSSLRSAPrivateKey *priv;
  
  if ((in_RSI != (undefined8 *)0x0) &&
     (sVar2 = ByteString::size((ByteString *)0x139fe5), sVar2 != 0)) {
    this_00 = (OSSLRSAPrivateKey *)operator_new(0x150);
    OSSLRSAPrivateKey::OSSLRSAPrivateKey(this_00);
    uVar1 = (*(this_00->super_RSAPrivateKey).super_PrivateKey.super_Serialisable._vptr_Serialisable
              [0x18])(this_00,in_RDX);
    if ((uVar1 & 1) == 0) {
      if (this_00 != (OSSLRSAPrivateKey *)0x0) {
        (*(this_00->super_RSAPrivateKey).super_PrivateKey.super_Serialisable._vptr_Serialisable[2])
                  ();
      }
      return false;
    }
    *in_RSI = this_00;
    return true;
  }
  return false;
}

Assistant:

bool OSSLRSA::reconstructPrivateKey(PrivateKey** ppPrivateKey, ByteString& serialisedData)
{
	// Check input
	if ((ppPrivateKey == NULL) ||
	    (serialisedData.size() == 0))
	{
		return false;
	}

	OSSLRSAPrivateKey* priv = new OSSLRSAPrivateKey();

	if (!priv->deserialise(serialisedData))
	{
		delete priv;

		return false;
	}

	*ppPrivateKey = priv;

	return true;
}